

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O1

void do_cmd_wiz_play_item(command *cmd)

{
  byte bVar1;
  player_upkeep *ppVar2;
  bool bVar3;
  bool bVar4;
  object *poVar5;
  _Bool _Var6;
  wchar_t wVar7;
  wchar_t wVar8;
  errr eVar9;
  command_conflict *pcVar10;
  cmd_code c;
  char *pcVar11;
  object *obj;
  wchar_t object_changed;
  char ch;
  wchar_t display_all_prop;
  object *orig_obj;
  object *local_58;
  int local_4c;
  byte local_45;
  wchar_t local_44;
  object *local_40;
  object *local_38;
  object *poStack_30;
  
  local_58 = (object *)0x0;
  local_40 = (object *)0x0;
  local_44 = L'\x01';
  local_4c = 0;
  wVar7 = cmd_get_arg_item((command_conflict *)cmd,"original_item",&local_40);
  poVar5 = local_40;
  wVar8 = cmd_get_arg_item((command_conflict *)cmd,"item",&local_58);
  if ((wVar7 == L'\0') && (poVar5 != (object *)0x0)) {
    if (local_58 == (object *)0x0 || wVar8 != L'\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/cmd-wizard.c"
                    ,0x672,"void do_cmd_wiz_play_item(struct command *)");
    }
    wVar7 = cmd_get_arg_choice((command_conflict *)cmd,"all_prop",&local_44);
    if (wVar7 != L'\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/cmd-wizard.c"
                    ,0x677,"void do_cmd_wiz_play_item(struct command *)");
    }
    wVar7 = cmd_get_arg_choice((command_conflict *)cmd,"changed",&local_4c);
    if (wVar7 != L'\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/cmd-wizard.c"
                    ,0x67c,"void do_cmd_wiz_play_item(struct command *)");
    }
  }
  else {
    if ((local_58 == (object *)0x0 || wVar8 != L'\0') &&
       (_Var6 = get_item(&local_58,"Play with which object? ","You have nothing to play with.",
                         cmd->code,(item_tester)0x0,L'\x0f'), !_Var6)) {
      return;
    }
    cmd_set_arg_item((command_conflict *)cmd,"item",local_58);
    local_40 = object_new();
    object_copy(local_40,local_58);
    cmd_set_arg_item((command_conflict *)cmd,"original_item",local_40);
    wVar7 = cmd_get_arg_choice((command_conflict *)cmd,"all_prop",&local_44);
    if (wVar7 != L'\0') {
      local_44 = L'\x01';
      cmd_set_arg_choice((command_conflict *)cmd,"all_prop",L'\x01');
    }
    wVar7 = cmd_get_arg_choice((command_conflict *)cmd,"changed",&local_4c);
    if (wVar7 != L'\0') {
      local_4c = 0;
      cmd_set_arg_choice((command_conflict *)cmd,"changed",L'\0');
    }
    screen_save();
  }
  wiz_display_item(local_58,local_44 != L'\0',player);
  _Var6 = get_com("[a]ccept [s]tatistics [r]eroll [t]weak [c]urse [q]uantity [k]nown? ",
                  (char *)&local_45);
  if (!_Var6) {
    pcVar11 = (char *)0x0;
    if (local_4c != 0) {
      pcVar11 = "Changes ignored.";
    }
    bVar1 = 1;
    goto LAB_001344b2;
  }
  bVar1 = 1;
  bVar3 = false;
  if (0x60 < local_45) {
    switch(local_45) {
    case 0x6b:
      goto switchD_0013449a_caseD_4b;
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x70:
      goto switchD_0013449a_caseD_4c;
    case 0x71:
      goto switchD_0013449a_caseD_51;
    case 0x72:
      goto switchD_0013449a_caseD_52;
    case 0x73:
      goto switchD_0013449a_caseD_53;
    case 0x74:
      goto switchD_0013449a_caseD_54;
    default:
      if (local_45 != 99) {
        bVar4 = false;
        if (local_45 != 0x61) goto LAB_0013462f;
        goto LAB_00134525;
      }
LAB_001345e2:
      c = CMD_WIZ_CURSE_ITEM;
      goto LAB_001345e7;
    }
  }
  switch(local_45) {
  case 0x4b:
switchD_0013449a_caseD_4b:
    local_44 = (wchar_t)(local_44 == L'\0');
    cmd_set_arg_choice((command_conflict *)cmd,"all_prop",local_44);
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
    goto switchD_0013449a_caseD_4c;
  case 0x51:
switchD_0013449a_caseD_51:
    c = CMD_WIZ_CHANGE_ITEM_QUANTITY;
    break;
  case 0x52:
switchD_0013449a_caseD_52:
    c = CMD_WIZ_REROLL_ITEM;
    break;
  case 0x53:
switchD_0013449a_caseD_53:
    eVar9 = cmdq_push(CMD_WIZ_STAT_ITEM);
    if (eVar9 == 0) {
      pcVar10 = cmdq_peek();
      cmd_set_arg_item(pcVar10,"item",local_58);
      goto switchD_0013449a_caseD_4c;
    }
    goto LAB_001345f3;
  case 0x54:
switchD_0013449a_caseD_54:
    c = CMD_WIZ_TWEAK_ITEM;
    break;
  default:
    if (local_45 == 0x41) {
LAB_00134525:
      bVar4 = true;
      if (local_4c != 0) {
        _Var6 = object_is_carried(player,local_58);
        if (_Var6) {
          bVar1 = local_58->number;
          if ((bVar1 != local_40->number) || (local_58->weight != local_40->weight)) {
            ppVar2 = player->upkeep;
            wVar7 = ppVar2->total_weight - (int)local_40->weight * (uint)local_40->number;
            ppVar2->total_weight = wVar7;
            ppVar2->total_weight = (int)local_58->weight * (uint)bVar1 + wVar7;
          }
        }
        wiz_play_item_standard_upkeep(player,local_58);
      }
      bVar3 = false;
      bVar1 = 0;
    }
    else {
      bVar4 = false;
      if (local_45 == 0x43) goto LAB_001345e2;
    }
    goto LAB_0013462f;
  }
LAB_001345e7:
  eVar9 = cmdq_push(c);
  if (eVar9 == 0) {
    pcVar10 = cmdq_peek();
    cmd_set_arg_item(pcVar10,"item",local_58);
    pcVar10 = cmdq_peek();
    cmd_set_arg_choice(pcVar10,"update",L'\0');
switchD_0013449a_caseD_4c:
    bVar3 = false;
    bVar1 = 1;
    bVar4 = false;
  }
  else {
LAB_001345f3:
    bVar1 = 1;
    bVar4 = false;
    bVar3 = true;
  }
LAB_0013462f:
  if ((bVar3) &&
     (_Var6 = get_check("Couldn\'t proceed.  Stop playing with item and lose all changes? "), _Var6)
     ) {
    pcVar11 = (char *)0x0;
    if (local_4c != 0) {
      pcVar11 = "Bailed out.  Changes to item lost.";
    }
LAB_001344b2:
    bVar4 = true;
  }
  else {
    pcVar11 = (char *)0x0;
  }
  bVar3 = bVar4;
  if (!bVar4) {
    eVar9 = cmdq_push_copy((command_conflict *)cmd);
    if (eVar9 != 0) {
      pcVar11 = "Couldn\'t queue command.  Changes lost.";
    }
    bVar3 = true;
    if (eVar9 == 0) {
      bVar3 = bVar4;
    }
  }
  if (bVar3) {
    if ((bool)(bVar1 & local_4c != 0)) {
      local_38 = local_58->prev;
      poStack_30 = local_58->next;
      mem_free(local_58->slays);
      local_58->slays = (_Bool *)0x0;
      mem_free(local_58->brands);
      local_58->brands = (_Bool *)0x0;
      mem_free(local_58->curses);
      local_58->curses = (curse_data *)0x0;
      object_copy(local_58,local_40);
      local_58->prev = local_38;
      local_58->next = poStack_30;
    }
    object_delete((chunk *)cave,(chunk *)player->cave,&local_40);
    cmd_set_arg_item((command_conflict *)cmd,"original_item",(object *)0x0);
    cmd_set_arg_choice((command_conflict *)cmd,"changed",L'\0');
    screen_load();
    if (pcVar11 != (char *)0x0) {
      msg("%s",pcVar11);
    }
  }
  return;
}

Assistant:

void do_cmd_wiz_play_item(struct command *cmd)
{
	struct object *obj = NULL;
	struct object *orig_obj = NULL;
	int display_all_prop = 1;
	int object_changed = 0;
	bool done = false;
	bool rejected = true;
	const char *done_msg = NULL;
	char ch;

	/*
	 * When called to initiate a play session, "item" may be set, but
	 * "original_item" should not be set or should be set to NULL.
	 * Subsequent calls in the same session will have both set to
	 * non-NULL vales along with "all_prop" and "changed".
	 */
	if (cmd_get_arg_item(cmd, "original_item", &orig_obj) == CMD_OK &&
			orig_obj) {
		if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK || !obj) {
			assert(0);
			return;
		}
		if (cmd_get_arg_choice(cmd, "all_prop", &display_all_prop) !=
				CMD_OK) {
			assert(0);
			return;
		}
		if (cmd_get_arg_choice(cmd, "changed", &object_changed) !=
				CMD_OK) {
			assert(0);
			return;
		}
	} else {
		if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK || !obj) {
			if (!get_item(&obj, "Play with which object? ",
					"You have nothing to play with.",
					cmd->code, NULL, (USE_EQUIP |
					USE_INVEN | USE_QUIVER | USE_FLOOR))) {
				return;
			}
		}

		/* Remember the object. */
		cmd_set_arg_item(cmd, "item", obj);

		/* Make a copy so changes can be rejected. */
		orig_obj = object_new();
		object_copy(orig_obj, obj);
		cmd_set_arg_item(cmd, "original_item", orig_obj);

		/*
		 * Store whether all properties are shown or only the known
		 * ones.
		 */
		if (cmd_get_arg_choice(cmd, "all_prop", &display_all_prop) !=
				CMD_OK) {
			display_all_prop = 1;
			cmd_set_arg_choice(cmd, "all_prop", display_all_prop);
		}

		/*
		 * Store whether the working item may have changed from the
		 * original.
		 */
		if (cmd_get_arg_choice(cmd, "changed", &object_changed) !=
				CMD_OK) {
			object_changed = 0;
			cmd_set_arg_choice(cmd, "changed", object_changed);
		}

		/* Save screen. */
		screen_save();
	}

	/* Display the (possibly modified) item. */
	wiz_display_item(obj, display_all_prop != 0, player);

	/* Get choice. */
	if (get_com("[a]ccept [s]tatistics [r]eroll [t]weak [c]urse [q]uantity [k]nown? ", &ch)) {
		bool queue_failed = false;

		switch (ch) {
			case 'A':
			case 'a':
				/* Accept whatever changes were made. */
				done = true;
				rejected = false;
				if (object_changed) {
					/* Mark for updates. */
					if (object_is_carried(player, obj) &&
							(obj->number !=
							orig_obj->number ||
							obj->weight !=
							orig_obj->weight)) {
						/*
						 * Remove the weight of the old
						 * version.
						 */
						player->upkeep->total_weight -=
							orig_obj->number *
							orig_obj->weight;

						/*
						 * Add the weight of the new
						 * version.
						 */
						player->upkeep->total_weight +=
							obj->number *
							obj->weight;
					}
					wiz_play_item_standard_upkeep(player,
						obj);
				}
				break;

			case 'C':
			case 'c':
				/* Change a curse on the item. */
				if (cmdq_push(CMD_WIZ_CURSE_ITEM) == 0) {
					cmd_set_arg_item(cmdq_peek(), "item",
						obj);
					cmd_set_arg_choice(cmdq_peek(),
						"update", 0);
				} else {
					queue_failed = true;
				}
				break;

			case 'S':
			case 's':
				/* Get statistics about the item. */
				if (cmdq_push(CMD_WIZ_STAT_ITEM) == 0) {
					cmd_set_arg_item(cmdq_peek(), "item",
						obj);
				} else {
					queue_failed = true;
				}
				break;

			case 'R':
			case 'r':
				/* Reroll the item. */
				if (cmdq_push(CMD_WIZ_REROLL_ITEM) == 0) {
					cmd_set_arg_item(cmdq_peek(), "item",
						obj);
					cmd_set_arg_choice(cmdq_peek(),
						"update", 0);
				} else {
					queue_failed = true;
				}
				break;

			case 'T':
			case 't':
				/* Tweak the object's properties. */
				if (cmdq_push(CMD_WIZ_TWEAK_ITEM) == 0) {
					cmd_set_arg_item(cmdq_peek(), "item",
						obj);
					cmd_set_arg_choice(cmdq_peek(),
						"update", 0);
				} else {
					queue_failed = true;
				}
				break;

			case 'K':
			case 'k':
				/* Toggle whether showing all properties. */
				display_all_prop = !display_all_prop;
				cmd_set_arg_choice(cmd, "all_prop",
					display_all_prop);
				break;

			case 'Q':
			case 'q':
				/* Change the number of items in the stack. */
				if (cmdq_push(CMD_WIZ_CHANGE_ITEM_QUANTITY) == 0) {
					cmd_set_arg_item(cmdq_peek(), "item",
						obj);
					cmd_set_arg_choice(cmdq_peek(),
						"update", 0);
				} else {
					queue_failed = true;
				}
				break;

			default:
				/*
				 * Don't have to do anything, next pass through
				 * will ask again what's wanted.
				 */
				break;
		}

		if (queue_failed &&
				get_check("Couldn't proceed.  Stop playing with item and lose all changes? ")) {
			done = true;
			if (object_changed) {
				done_msg = "Bailed out.  Changes to item lost.";
			}
		}
	} else {
		done = true;
		if (object_changed) {
			done_msg = "Changes ignored.";
		}
	}

	if (!done) {
		/* Push the command back on the queue to be reexecuted. */
		if (cmdq_push_copy(cmd) != 0) {
			/* Failed.  Bail out without saving changes. */
			done = true;
			done_msg = "Couldn't queue command.  Changes lost.";
		}
	}

	if (done) {
		if (rejected && object_changed) {
			/*
			 * Restore to the original values.  The pile links
			 * require special handling because object_copy()
			 * resets them.
			 */
			struct object *prev = obj->prev;
			struct object *next = obj->next;

			/* Free slays, brands, and curses by hand. */
			mem_free(obj->slays);
			obj->slays = NULL;
			mem_free(obj->brands);
			obj->brands = NULL;
			mem_free(obj->curses);
			obj->curses = NULL;

			object_copy(obj, orig_obj);
			obj->prev = prev;
			obj->next = next;
		}

		/* Release the preserved copy. */
		object_delete(cave, player->cave, &orig_obj);

		/*
		 * Reset the original_item and changed arguments so repeating
		 * the command will start a new play session without a
		 * dangling reference to the deleted preserved copy.
		 */
		cmd_set_arg_item(cmd, "original_item", NULL);
		cmd_set_arg_choice(cmd, "changed", 0);

		/* Restore the screen. */
		screen_load();

		/* Provide some feedback. */
		if (done_msg) {
			msg("%s", done_msg);
		}
	}
}